

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O3

ion_status_t linear_hash_delete(ion_byte_t *key,linear_hash_table_t *linear_hash)

{
  byte *pbVar1;
  void *__src;
  ion_key_size_t iVar2;
  FILE *pFVar3;
  ion_dictionary_compare_t p_Var4;
  ion_byte_t *piVar5;
  ion_byte_t *piVar6;
  ion_byte_t *key_00;
  byte bVar7;
  char cVar8;
  void *__dest;
  long lVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  void *__s;
  ion_fpos_t iVar17;
  linear_hash_table_t *linear_hash_00;
  int key_bytes_as_int;
  uint uVar18;
  undefined8 uStack_c0;
  undefined8 local_b8;
  long local_b0;
  ion_byte_t *local_a8;
  undefined1 local_a0 [8];
  linear_hash_bucket_t bucket;
  long local_68;
  ion_fpos_t swap_record_loc;
  int local_54;
  long local_50;
  ion_byte_t *local_48;
  linear_hash_table_t *local_40;
  int local_38;
  ion_byte_t local_31 [8];
  ion_byte_t terminal_record_status;
  
  iVar11 = (linear_hash->super).record.key_size;
  if (iVar11 < 2) {
    uVar15 = 0;
    if (linear_hash->next_split < 1) goto LAB_0010b679;
    iVar11 = linear_hash->initial_size;
  }
  else {
    uVar14 = (ulong)(iVar11 - 1);
    uVar12 = 0;
    uVar15 = 0;
    iVar11 = 3;
    do {
      pbVar1 = key + uVar12;
      lVar9 = uVar12 + 1;
      uVar12 = uVar12 + 1;
      uVar15 = uVar15 + (key_bytes_to_int::coefficients[lVar9] - iVar11) * (uint)*pbVar1;
      iVar11 = key_bytes_to_int::coefficients[lVar9];
    } while (uVar14 != uVar12);
    iVar11 = linear_hash->initial_size;
    uVar15 = iVar11 - 1U & uVar15;
    if (linear_hash->next_split <= (int)uVar15) goto LAB_0010b679;
    uVar12 = 0;
    uVar15 = 0;
    iVar16 = 3;
    do {
      pbVar1 = key + uVar12;
      lVar9 = uVar12 + 1;
      uVar12 = uVar12 + 1;
      uVar15 = uVar15 + (key_bytes_to_int::coefficients[lVar9] - iVar16) * (uint)*pbVar1;
      iVar16 = key_bytes_to_int::coefficients[lVar9];
    } while (uVar14 != uVar12);
  }
  uVar15 = uVar15 & iVar11 * 2 - 1U;
LAB_0010b679:
  iVar17 = -1;
  if ((int)uVar15 < linear_hash->bucket_map->current_size) {
    iVar17 = linear_hash->bucket_map->data[(int)uVar15];
  }
  uStack_c0 = 0x10b6a6;
  local_48 = key;
  bVar7 = linear_hash_get_bucket(iVar17,(linear_hash_bucket_t *)local_a0,linear_hash);
  if (bVar7 == 0) {
    uVar14 = (long)(linear_hash->super).record.key_size + 0xfU & 0xfffffffffffffff0;
    __dest = (void *)((long)&local_b8 - uVar14);
    uVar12 = (long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0;
    bucket.overflow_location = (long)__dest - uVar12;
    sVar13 = (long)linear_hash->records_per_bucket * linear_hash->record_total_size;
    __s = (void *)(bucket.overflow_location - (sVar13 + 0xf & 0xfffffffffffffff0));
    local_40 = linear_hash;
    *(undefined8 *)((long)__s + -8) = 0x10b71c;
    memset(__s,0,sVar13);
    local_a8 = (ion_byte_t *)((long)__s - uVar14);
    lVar9 = (long)local_a8 - uVar12;
    local_31[0] = '\0';
    local_40->last_cache_idx = 0;
    uVar18 = 0;
    linear_hash_00 = local_40;
    swap_record_loc = lVar9;
    do {
      pFVar3 = (FILE *)linear_hash_00->database;
      local_50 = iVar17 + 0x10;
      *(undefined8 *)(lVar9 + -8) = 0x10b767;
      fseek(pFVar3,iVar17 + 0x10,0);
      iVar11 = linear_hash_00->records_per_bucket;
      sVar13 = linear_hash_00->record_total_size;
      pFVar3 = (FILE *)linear_hash_00->database;
      *(undefined8 *)(lVar9 + -8) = 0x10b77c;
      fread(__s,sVar13,(long)iVar11,pFVar3);
      local_54 = local_a0._4_4_;
      if (0 < (int)local_a0._4_4_) {
        lVar10 = 0;
        iVar11 = 0;
        local_b0 = iVar17;
        do {
          __src = (void *)((long)__s + lVar10 + 1);
          iVar16 = (linear_hash_00->super).record.key_size;
          cVar8 = *(char *)((long)__src + -1);
          local_b8 = lVar10;
          local_38 = iVar11;
          *(undefined8 *)(lVar9 + -8) = 0x10b7cc;
          memcpy(__dest,__src,(long)iVar16);
          linear_hash_00 = local_40;
          iVar17 = bucket.overflow_location;
          iVar11 = (local_40->super).record.value_size;
          *(undefined8 *)(lVar9 + -8) = 0x10b7e7;
          memcpy((void *)iVar17,(void *)((long)__s + iVar16 + lVar10 + 1),(long)iVar11);
          piVar5 = local_48;
          if (cVar8 != '\0') {
            p_Var4 = (linear_hash_00->super).compare;
            *(undefined8 *)(lVar9 + -8) = 0x10b7f9;
            cVar8 = (*p_Var4)(__dest,piVar5,iVar16);
            iVar17 = bucket.overflow_location;
            if (cVar8 == '\0') {
              iVar11 = linear_hash_00->last_cache_idx;
              sVar13 = (size_t)(linear_hash_00->super).record.value_size;
              piVar5 = linear_hash_00->cache;
              *(undefined8 *)(lVar9 + -8) = 0x10b82b;
              memcpy(piVar5 + (long)iVar11 * sVar13,(void *)iVar17,sVar13);
              iVar17 = swap_record_loc;
              key_00 = local_a8;
              linear_hash_00->last_cache_idx = linear_hash_00->last_cache_idx + 1;
              local_68 = local_50;
              *(undefined8 *)(lVar9 + -8) = 0x10b85a;
              linear_hash_get_bucket_swap_record
                        (uVar15,&local_68,key_00,(ion_byte_t *)iVar17,local_31,linear_hash_00);
              piVar5 = local_48;
              iVar2 = (linear_hash_00->super).record.key_size;
              p_Var4 = (linear_hash_00->super).compare;
              *(undefined8 *)(lVar9 + -8) = 0x10b869;
              cVar8 = (*p_Var4)(key_00,piVar5,iVar2);
              piVar5 = (ion_byte_t *)swap_record_loc;
              while (swap_record_loc = (ion_fpos_t)piVar5, cVar8 == '\0') {
                iVar11 = linear_hash_00->last_cache_idx;
                sVar13 = (size_t)(linear_hash_00->super).record.value_size;
                piVar6 = linear_hash_00->cache;
                *(undefined8 *)(lVar9 + -8) = 0x10b8f6;
                memcpy(piVar6 + (long)iVar11 * sVar13,piVar5,sVar13);
                linear_hash_00->last_cache_idx = linear_hash_00->last_cache_idx + 1;
                if (local_50 == local_68) break;
                *(undefined8 *)(lVar9 + -8) = 0x10b920;
                linear_hash_get_bucket_swap_record
                          (uVar15,&local_68,key_00,piVar5,local_31,linear_hash_00);
                piVar5 = local_48;
                if (local_31[0] == '\0') break;
                uVar18 = uVar18 + 1;
                iVar2 = (linear_hash_00->super).record.key_size;
                p_Var4 = (linear_hash_00->super).compare;
                *(undefined8 *)(lVar9 + -8) = 0x10b93c;
                cVar8 = (*p_Var4)(key_00,piVar5,iVar2);
                piVar5 = (ion_byte_t *)swap_record_loc;
              }
              lVar10 = local_50;
              iVar17 = swap_record_loc;
              if (local_50 != local_68) {
                *(undefined8 *)(lVar9 + -8) = 0x10b892;
                linear_hash_write_record(lVar10,key_00,(ion_byte_t *)iVar17,local_31,linear_hash_00)
                ;
              }
              lVar10 = local_b0;
              uVar18 = uVar18 + 1;
              *(undefined8 *)(lVar9 + -8) = 0x10b8ab;
              linear_hash_get_bucket(lVar10,(linear_hash_bucket_t *)local_a0,linear_hash_00);
              local_54 = local_a0._4_4_;
            }
          }
          local_50 = local_50 + linear_hash_00->record_total_size;
          lVar10 = local_b8 + linear_hash_00->record_total_size;
          iVar11 = local_38 + 1;
        } while (iVar11 < local_54);
      }
      iVar17 = bucket._0_8_;
      if (bucket._0_8_ == -1) {
        bVar7 = uVar18 == 0;
        break;
      }
      *(undefined8 *)(lVar9 + -8) = 0x10b968;
      bVar7 = linear_hash_get_bucket(iVar17,(linear_hash_bucket_t *)local_a0,linear_hash_00);
    } while (bVar7 == 0);
    uVar14 = (ulong)uVar18 << 0x20;
  }
  else {
    uVar14 = 0;
  }
  return (ion_status_t)(bVar7 | uVar14);
}

Assistant:

ion_status_t
linear_hash_delete(
	ion_byte_t			*key,
	linear_hash_table_t *linear_hash
) {
	/* status for result count */
	ion_status_t status = ION_STATUS_INITIALIZE;
	/* get the index of the bucket to read */
	int bucket_idx		= insert_hash_to_bucket(key, linear_hash);

	if (bucket_idx < linear_hash->next_split) {
		bucket_idx = hash_to_bucket(key, linear_hash);
	}

	/* get the bucket where the record would be located */
	ion_fpos_t				bucket_loc = bucket_idx_to_ion_fpos_t(bucket_idx, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	/* create a linear_hash_record with the desired key, value, and status of full*/
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_empty;

	int i;

	ion_byte_t *records = alloca(linear_hash->record_total_size * linear_hash->records_per_bucket);

	memset(records, 0, linear_hash->record_total_size * linear_hash->records_per_bucket);

	ion_fpos_t	record_offset = 0;
	ion_fpos_t	record_loc;

	/* memory allocated to transfer the terminal records to delete location for swap on delete */
	ion_byte_t	*terminal_record_key	= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*terminal_record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	terminal_record_status	= linear_hash_record_status_empty;

	linear_hash->last_cache_idx = 0;

	ion_boolean_t terminal = boolean_false;

	while (terminal == boolean_false) {
		record_loc = bucket_loc + sizeof(linear_hash_bucket_t);
		fseek(linear_hash->database, bucket_loc + sizeof(linear_hash_bucket_t), SEEK_SET);
		fread(records, linear_hash->record_total_size, linear_hash->records_per_bucket, linear_hash->database);

		for (i = 0; i < bucket.record_count; i++) {
			/* read in record */
			memcpy(&record_status, records + record_offset, sizeof(record_status));
			memcpy(record_key, records + record_offset + sizeof(record_status), linear_hash->super.record.key_size);
			memcpy(record_value, records + record_offset + sizeof(record_status) + linear_hash->super.record.key_size, linear_hash->super.record.value_size);

			if (record_status != 0) {
				if (linear_hash->super.compare(record_key, key, linear_hash->super.record.key_size) == 0) {
					/* TODO Create wrapper methods and implement proper error propagation */
					/* cache the record being deleted's value */
					memcpy(linear_hash->cache + linear_hash->last_cache_idx * linear_hash->super.record.value_size, record_value, linear_hash->super.record.value_size);
					linear_hash->last_cache_idx++;

					/* store the record_loc in a write back paramter that is used before being overwritten */
					ion_fpos_t swap_record_loc = record_loc;

					/* obtain the swap record */
					linear_hash_get_bucket_swap_record(bucket_idx, &swap_record_loc, terminal_record_key, terminal_record_value, &terminal_record_status, linear_hash);

					/* delete all swap records which are going to be deleted anyways */
					while (linear_hash->super.compare(terminal_record_key, key, linear_hash->super.record.key_size) == 0) {
						memcpy(linear_hash->cache + linear_hash->last_cache_idx * linear_hash->super.record.value_size, terminal_record_value, linear_hash->super.record.value_size);
						linear_hash->last_cache_idx++;

						/* if we are not trying to swap a record with itself */
						if (record_loc == swap_record_loc) {
							/* write the swapped record to record_loc */
							break;
						}

						linear_hash_get_bucket_swap_record(bucket_idx, &swap_record_loc, terminal_record_key, terminal_record_value, &terminal_record_status, linear_hash);

						if (terminal_record_status == linear_hash_record_status_empty) {
							break;
						}

						status.count++;
					}

					/* if we are not trying to swap a record with itself */
					if (record_loc != swap_record_loc) {
						/* write the swapped record to record_loc */
						linear_hash_write_record(record_loc, terminal_record_key, terminal_record_value, &terminal_record_status, linear_hash);
					}

					status.count++;

					if (status.error != err_ok) {
						return status;
					}

					linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);
				}
			}

			record_loc		+= linear_hash->record_total_size;
			record_offset	+= linear_hash->record_total_size;
		}

		if (bucket.overflow_location == linear_hash_end_of_list) {
			terminal = boolean_true;
		}
		else {
			record_offset	= 0;
			bucket_loc		= bucket.overflow_location;
			status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

			if (status.error != err_ok) {
				return status;
			}
		}
	}

	if (status.count == 0) {
		status.error = err_item_not_found;
	}
	else {
		status.error = err_ok;
	}

	return status;
}